

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O0

ON_String ON_VersionNumberToString(uint version_number,bool bUnsignedFormat,bool bDateFormat)

{
  bool bVar1;
  byte in_CL;
  undefined7 in_register_00000031;
  undefined4 in_register_0000003c;
  ON_String *this;
  undefined8 in_stack_ffffffffffffff78;
  uint *version_branch_00;
  undefined4 uVar2;
  ON_String local_60;
  ON_String local_58 [3];
  ON_String local_40;
  undefined1 local_31;
  uint local_30;
  uint local_2c;
  uint version_branch;
  uint version_day_of_month;
  uint version_month;
  uint version_year;
  uint version_minor;
  uint version_major;
  bool bDateFormat_local;
  bool bUnsignedFormat_local;
  ON_String *pOStack_10;
  uint version_number_local;
  ON_String *str_version;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  this = (ON_String *)CONCAT44(in_register_0000003c,version_number);
  version_major = (uint)CONCAT71(in_register_00000031,bUnsignedFormat);
  version_minor._2_1_ = in_CL & 1;
  version_year = 0;
  version_month = 0;
  version_day_of_month = 0;
  version_branch = 0;
  local_2c = 0;
  local_30 = 0;
  version_minor._3_1_ = bDateFormat;
  pOStack_10 = this;
  bVar1 = ON_VersionNumberIsValid(version_major);
  if (bVar1) {
    if ((version_minor._2_1_ & 1) != 0) {
      version_branch_00 = &local_30;
      version_minor._2_1_ =
           ON_VersionNumberParse
                     (version_major,&version_year,&version_month,&version_day_of_month,
                      &version_branch,&local_2c,version_branch_00);
      uVar2 = (undefined4)((ulong)version_branch_00 >> 0x20);
    }
  }
  else {
    version_minor._3_1_ = 0;
    version_minor._2_1_ = 0;
  }
  local_31 = 0;
  ON_String::ON_String(this);
  if ((version_minor._3_1_ & 1) != 0) {
    ON_String::FormatToString((char *)&local_40,"%u",(ulong)version_major);
    ON_String::operator=(this,&local_40);
    ON_String::~ON_String(&local_40);
    if ((version_minor._2_1_ & 1) != 0) {
      ON_String::operator+=(this," (");
    }
  }
  if ((version_minor._2_1_ & 1) != 0) {
    ON_String::FormatToString
              ((char *)local_58,"%u.%u %04u-%02u-%02u:%u",(ulong)version_year,(ulong)version_month,
               (ulong)version_day_of_month,(ulong)version_branch,CONCAT44(uVar2,local_2c),local_30);
    ON_String::operator+=(this,local_58);
    ON_String::~ON_String(local_58);
    if ((version_minor._3_1_ & 1) != 0) {
      ON_String::operator+=(this,")");
    }
  }
  bVar1 = ON_String::IsEmpty(this);
  if (bVar1) {
    if (version_major == 0) {
      ON_String::ON_String(&local_60,"0");
    }
    else {
      ON_String::FormatToString((char *)&local_60,"0x%08X",(ulong)version_major);
    }
    ON_String::operator=(this,&local_60);
    ON_String::~ON_String(&local_60);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_VersionNumberToString(
  unsigned int version_number,
  bool bUnsignedFormat,
  bool bDateFormat
)
{
  unsigned int version_major = 0;
  unsigned int version_minor = 0;
  unsigned int version_year = 0;
  unsigned int version_month = 0;
  unsigned int version_day_of_month = 0;
  unsigned int version_branch = 0;

  if (false == ON_VersionNumberIsValid(version_number))
  {
    bUnsignedFormat = false;
    bDateFormat = false;
  }
  else if (bDateFormat)
  {
    bDateFormat = ON_VersionNumberParse(
      version_number,
      &version_major,
      &version_minor,
      &version_year,
      &version_month,
      &version_day_of_month,
      &version_branch
    );
  }

  ON_String str_version;
  if (bUnsignedFormat)
  {
    str_version = ON_String::FormatToString("%u", version_number);
    if (bDateFormat)
      str_version += " (";
  }

  if (bDateFormat)
  {
    str_version += ON_String::FormatToString(
      "%u.%u %04u-%02u-%02u:%u", 
    version_major,
    version_minor, 
    version_year, 
    version_month, 
    version_day_of_month,
    version_branch
    );
    if (bUnsignedFormat)
      str_version += ")";
  }

  if (str_version.IsEmpty())
  {
    str_version =
      (0 != version_number)
      ? ON_String::FormatToString("0x%08X", version_number)
      : "0";
  }

  return str_version;
}